

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csv_schema.hpp
# Opt level: O0

void __thiscall duckdb::CSVColumnInfo::~CSVColumnInfo(CSVColumnInfo *this)

{
  string *in_RDI;
  
  LogicalType::~LogicalType((LogicalType *)0x14e1a4c);
  ::std::__cxx11::string::~string(in_RDI);
  return;
}

Assistant:

CSVColumnInfo(const string &name_p, const LogicalType &type_p) : name(name_p), type(type_p) {
	}